

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_url.c
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  char *pcVar2;
  curi_status cVar3;
  char *pcVar4;
  char *pcVar5;
  size_t local_820;
  char buf [2048];
  
  pcVar2 = *argv;
  pcVar4 = strrchr(pcVar2,0x2f);
  pcVar5 = pcVar4 + 1;
  if (pcVar4 == (char *)0x0) {
    pcVar5 = pcVar2;
  }
  if (argc == 2) {
    pcVar2 = argv[1];
    if (*pcVar2 != '-') {
      cVar3 = curi_url_decode_nt(pcVar2,buf,0x800,&local_820);
      if (cVar3 != curi_status_success) {
        fwrite("curi_url_decode_nt() failed\n",0x1c,1,_stderr);
        return 1;
      }
      buf[local_820] = '\0';
      puts(buf);
      return 0;
    }
    cVar1 = pcVar2[1];
    if ((cVar1 != '\0') && (pcVar2[2] == '\0')) {
      if (cVar1 != 'h') {
        fprintf(_stderr,"unknown option: \'%c\'\n",(ulong)(uint)(int)cVar1);
        return 1;
      }
      fprintf(_stdout,"usage: %s [-h] url\n",pcVar5);
      return 0;
    }
  }
  fprintf(_stderr,"wrong # args: must be \"%s [-h] url\"\n",pcVar5);
  return 1;
}

Assistant:

int main(int argc, char** argv)
{
    int rc;

    if ((rc = parse_args(argc, argv)) < 0)
        return rc == EXIT_OK ? EXIT_SUCCESS : EXIT_FAILURE;

    return decode(argv[argc - 1]);
}